

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_vec2 rf_get_world_to_screen(rf_sizei screen_size,rf_vec3 position,rf_camera3d camera)

{
  undefined1 auVar1 [16];
  float fVar2;
  float fVar3;
  rf_vec2 rVar5;
  double dVar4;
  undefined1 auVar6 [16];
  double dVar7;
  undefined1 auVar8 [16];
  float fVar9;
  float fVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar13;
  undefined1 auVar14 [16];
  rf_mat mat_view;
  float local_a0;
  float local_9c;
  undefined1 local_98 [8];
  float fStack_90;
  float fStack_8c;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  rf_mat local_48;
  
  fVar13 = position.z;
  fVar9 = (float)screen_size.width;
  fVar12 = (float)screen_size.height;
  if (camera.type == RF_CAMERA_ORTHOGRAPHIC) {
    local_a0 = 0.0;
    local_9c = 1.0;
    _local_98 = ZEXT816(0);
    fVar3 = camera.fovy * 0.5;
    fVar2 = (fVar9 / fVar12) * fVar3;
    auVar8._0_8_ = CONCAT44(fVar3 + fVar3,fVar2 + fVar2);
    auVar8._8_8_ = auVar8._0_8_;
    auVar11._8_8_ = CONCAT44(fVar3 - fVar3,fVar2 - fVar2) ^ 0x8000000080000000;
    auVar11._0_8_ = 0x4000000040000000;
    _local_88 = divps(auVar11,auVar8);
  }
  else if (camera.type == RF_CAMERA_PERSPECTIVE) {
    dVar4 = tan((double)(camera.fovy * 0.017453292) * 0.5);
    dVar4 = dVar4 * 0.01;
    dVar7 = ((double)screen_size.width / (double)screen_size.height) * dVar4;
    auVar6._0_4_ = (float)(dVar7 + dVar7);
    auVar6._4_4_ = (float)(dVar4 + dVar4);
    auVar6._8_8_ = 0;
    auVar8 = divps(_DAT_00177ce0,auVar6);
    auVar10._0_4_ = (float)dVar7 - (float)dVar7;
    auVar10._4_4_ = (float)dVar4 - (float)dVar4;
    auVar10._8_8_ = 0;
    _local_98 = divps(auVar10,auVar6);
    _fStack_80 = 0;
    local_88 = (undefined1  [8])auVar8._0_8_;
    local_9c = 0.0;
    local_a0 = -1.0;
  }
  else {
    local_a0 = 0.0;
    local_9c = 1.0;
    _local_98 = ZEXT816(0);
    _local_88 = ZEXT816(0x3f8000003f800000);
  }
  rf_mat_look_at(&local_48,camera.position,camera.target,camera.up);
  local_78 = position.x;
  fStack_74 = position.y;
  local_48.m12 = local_48.m8 * fVar13 + local_48.m0 * local_78 + local_48.m4 * fStack_74 +
                 local_48.m12;
  local_48.m13 = local_48.m9 * fVar13 + local_48.m1 * local_78 + local_48.m5 * fStack_74 +
                 local_48.m13;
  local_48.m14 = local_48.m10 * fVar13 + local_48.m2 * local_78 + local_48.m6 * fStack_74 +
                 local_48.m14;
  local_48.m15 = fVar13 * local_48.m11 + local_48.m3 * local_78 + fStack_74 * local_48.m7 +
                 local_48.m15;
  auVar14._0_4_ =
       local_48.m15 * fStack_80 +
       local_48.m14 * (float)local_98._0_4_ +
       local_48.m12 * (float)local_88._0_4_ + local_48.m13 * 0.0;
  auVar14._4_4_ =
       local_48.m15 * fStack_7c +
       local_48.m14 * (float)local_98._4_4_ +
       local_48.m12 * 0.0 + local_48.m13 * (float)local_88._4_4_;
  auVar14._8_4_ =
       local_48.m15 * fStack_80 +
       local_48.m14 * fStack_90 + local_48.m12 * fStack_80 + local_48.m13 * 0.0;
  auVar14._12_4_ =
       local_48.m15 * fStack_7c +
       local_48.m14 * fStack_8c + local_48.m12 * fStack_7c + local_48.m13 * 0.0;
  fVar13 = local_48.m12 * 0.0 + local_48.m13 * 0.0 + local_a0 * local_48.m14 +
           local_9c * local_48.m15;
  auVar1._4_4_ = fVar13;
  auVar1._0_4_ = fVar13;
  auVar1._8_4_ = fVar13;
  auVar1._12_4_ = fVar13;
  auVar8 = divps(auVar14,auVar1);
  rVar5.x = (auVar8._0_4_ + 1.0) * 0.5 * fVar9;
  rVar5.y = (1.0 - auVar8._4_4_) * 0.5 * fVar12;
  return rVar5;
}

Assistant:

RF_API rf_vec2 rf_get_world_to_screen(rf_sizei screen_size, rf_vec3 position, rf_camera3d camera)
{
    // Calculate projection matrix from perspective instead of frustum
    rf_mat mat_proj = rf_mat_identity();

    if (camera.type == RF_CAMERA_PERSPECTIVE)
    {
        // Calculate projection matrix from perspective
        mat_proj = rf_mat_perspective(camera.fovy * RF_DEG2RAD, ((double) screen_size.width / (double) screen_size.height), 0.01, 1000.0);
    }
    else if (camera.type == RF_CAMERA_ORTHOGRAPHIC)
    {
        float aspect = (float) screen_size.width / (float) screen_size.height;
        double top = camera.fovy / 2.0;
        double right = top * aspect;

    // Calculate projection matrix from orthographic
        mat_proj = rf_mat_ortho(-right, right, -top, top, 0.01, 1000.0);
    }

    // Calculate view matrix from camera look at (and transpose it)
    rf_mat mat_view = rf_mat_look_at(camera.position, camera.target, camera.up);

    // Convert world position vector to quaternion
    rf_quaternion world_pos = { position.x, position.y, position.z, 1.0f };

    // Transform world position to view
    world_pos = rf_quaternion_transform(world_pos, mat_view);

    // Transform result to projection (clip space position)
    world_pos = rf_quaternion_transform(world_pos, mat_proj);

    // Calculate normalized device coordinates (inverted y)
    rf_vec3 ndc_pos = {world_pos.x / world_pos.w, -world_pos.y / world_pos.w, world_pos.z / world_pos.w};

    // Calculate 2d screen position vector
    rf_vec2 screen_position = {(ndc_pos.x + 1.0f) / 2.0f * (float) screen_size.width,
                               (ndc_pos.y + 1.0f) / 2.0f * (float) screen_size.height};

    return screen_position;
}